

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageControl::setCount(PageControl *this,int c)

{
  int iVar1;
  PageControlPrivate *pPVar2;
  PageControlPrivate *pPVar3;
  int prev;
  QRect local_24;
  int local_14;
  PageControl *pPStack_10;
  int c_local;
  PageControl *this_local;
  
  local_14 = c;
  pPStack_10 = this;
  pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
           ::operator->(&this->d);
  iVar1 = local_14;
  if ((pPVar2->count != local_14) && (-1 < local_14)) {
    pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    pPVar2->count = iVar1;
    pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    local_24 = QWidget::rect(&this->super_QWidget);
    iVar1 = QRect::width(&local_24);
    PageControlPrivate::updateButtonsInfo(pPVar2,iVar1);
    pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    QList<QRect>::clear(&pPVar2->rectangles);
    pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    if (pPVar2->count < 1) {
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      iVar1 = pPVar2->currentIndex;
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      pPVar2->currentIndex = -1;
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      currentChanged(this,pPVar2->currentIndex,iVar1);
    }
    else {
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      QList<QRect>::reserve(&pPVar2->rectangles,(long)pPVar3->count);
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      QRect::QRect((QRect *)&stack0xffffffffffffffcc);
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      QList<QRect>::fill(&pPVar2->rectangles,(parameter_type)&stack0xffffffffffffffcc,
                         (long)pPVar3->count);
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      PageControlPrivate::updateButtonsGeometry(pPVar2);
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      iVar1 = pPVar2->currentIndex;
      pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      if (pPVar2->count <= iVar1) {
        pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
                 ::operator->(&this->d);
        setCurrentIndex(this,pPVar2->count + -1);
      }
    }
  }
  return;
}

Assistant:

void
PageControl::setCount( int c )
{
	if( d->count != c && c >= 0 )
	{
		d->count = c;

		d->updateButtonsInfo( rect().width() );

		d->rectangles.clear();

		if( d->count > 0 )
		{
			d->rectangles.reserve( d->count );

			d->rectangles.fill( QRect(), d->count );

			d->updateButtonsGeometry();

			if( d->currentIndex >= d->count )
				setCurrentIndex( d->count - 1 );
		}
		else
		{
			const int prev = d->currentIndex;

			d->currentIndex = -1;

			emit currentChanged( d->currentIndex, prev );
		}
	}
}